

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t strncat_from_utf8_to_utf8(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  wchar_t wVar1;
  archive_string *paVar2;
  archive_string *in_RSI;
  long *in_RDI;
  size_t w;
  char *ss;
  uint32_t uc;
  wchar_t ret;
  wchar_t n;
  char *endp;
  char *p;
  char *s;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  archive_string *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  char *local_40;
  char *local_38;
  archive_string *local_30;
  wchar_t local_4;
  
  local_4 = L'\0';
  paVar2 = archive_string_ensure(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
  if (paVar2 == (archive_string *)0x0) {
    local_4 = L'\xffffffff';
  }
  else {
    local_38 = (char *)(*in_RDI + in_RDI[1]);
    local_40 = (char *)(*in_RDI + in_RDI[2] + -1);
    local_30 = in_RSI;
    do {
      while (wVar1 = utf8_to_unicode((uint32_t *)in_RSI,in_stack_ffffffffffffffa0,
                                     in_stack_ffffffffffffff98), L'\0' < wVar1) {
        local_30 = (archive_string *)((long)&local_30->s + (long)wVar1);
      }
      if (in_RSI < local_30) {
        if (local_40 < local_38 + ((long)local_30 - (long)in_RSI)) {
          in_RDI[1] = (long)local_38 - *in_RDI;
          paVar2 = archive_string_ensure(in_RSI,(size_t)in_stack_ffffffffffffffa0);
          if (paVar2 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          local_38 = (char *)(*in_RDI + in_RDI[1]);
          local_40 = (char *)(*in_RDI + in_RDI[2] + -1);
        }
        memcpy(local_38,in_RSI,(long)local_30 - (long)in_RSI);
        local_38 = local_38 + ((long)local_30 - (long)in_RSI);
      }
      if (wVar1 < L'\0') {
        if (((wVar1 == L'\xfffffffd') && (0xd7ff < in_stack_ffffffffffffffb4)) &&
           (in_stack_ffffffffffffffb4 < 0xe000)) {
          wVar1 = cesu8_to_unicode((uint32_t *)CONCAT44(0xfffffffd,local_4),
                                   (char *)CONCAT44(in_stack_ffffffffffffffb4,
                                                    in_stack_ffffffffffffffb0),(size_t)in_RSI);
        }
        if (wVar1 < L'\0') {
          local_4 = L'\xffffffff';
          wVar1 = -wVar1;
        }
        while (in_stack_ffffffffffffffa0 =
                    (char *)unicode_to_utf8(local_38,(long)local_40 - (long)local_38,
                                            in_stack_ffffffffffffffb4),
              in_stack_ffffffffffffffa0 == (char *)0x0) {
          in_RDI[1] = (long)local_38 - *in_RDI;
          paVar2 = archive_string_ensure(in_RSI,0);
          if (paVar2 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          local_38 = (char *)(*in_RDI + in_RDI[1]);
          local_40 = (char *)(*in_RDI + in_RDI[2] + -1);
        }
        local_38 = in_stack_ffffffffffffffa0 + (long)local_38;
        local_30 = (archive_string *)((long)&local_30->s + (long)wVar1);
      }
      in_RSI = local_30;
    } while (L'\0' < wVar1);
    in_RDI[1] = (long)local_38 - *in_RDI;
    *(undefined1 *)(*in_RDI + in_RDI[1]) = 0;
  }
  return local_4;
}

Assistant:

static int
strncat_from_utf8_to_utf8(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s;
	char *p, *endp;
	int n, ret = 0;

	(void)sc; /* UNUSED */

	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	endp = as->s + as->buffer_length -1;
	do {
		uint32_t uc;
		const char *ss = s;
		size_t w;

		/*
		 * Forward byte sequence until a conversion of that is needed.
		 */
		while ((n = utf8_to_unicode(&uc, s, len)) > 0) {
			s += n;
			len -= n;
		}
		if (ss < s) {
			if (p + (s - ss) > endp) {
				as->length = p - as->s;
				if (archive_string_ensure(as,
				    as->buffer_length + len + 1) == NULL)
					return (-1);
				p = as->s + as->length;
				endp = as->s + as->buffer_length -1;
			}

			memcpy(p, ss, s - ss);
			p += s - ss;
		}

		/*
		 * If n is negative, current byte sequence needs a replacement.
		 */
		if (n < 0) {
			if (n == -3 && IS_SURROGATE_PAIR_LA(uc)) {
				/* Current byte sequence may be CESU-8. */
				n = cesu8_to_unicode(&uc, s, len);
			}
			if (n < 0) {
				ret = -1;
				n *= -1;/* Use a replaced unicode character. */
			}

			/* Rebuild UTF-8 byte sequence. */
			while ((w = unicode_to_utf8(p, endp - p, uc)) == 0) {
				as->length = p - as->s;
				if (archive_string_ensure(as,
				    as->buffer_length + len + 1) == NULL)
					return (-1);
				p = as->s + as->length;
				endp = as->s + as->buffer_length -1;
			}
			p += w;
			s += n;
			len -= n;
		}
	} while (n > 0);
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (ret);
}